

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O2

int baud2i(speed_t baud)

{
  switch(baud) {
  case 0x1001:
    baud = 0xe100;
    break;
  case 0x1002:
    return 0x1c200;
  case 0x1003:
    return 0x38400;
  case 0x1004:
    return 0x70800;
  case 0x1005:
    return -1;
  case 0x1006:
    return 0x8ca00;
  case 0x1007:
    return 0xe1000;
  default:
    if (baud != 0) {
      if (baud == 0xf) {
        return 0x9600;
      }
      if (baud != 0xe) {
        if (baud != 0xd) {
          return -1;
        }
        return 0x2580;
      }
      return 0x4b00;
    }
  }
  return baud;
}

Assistant:

int baud2i(speed_t baud)
{
  switch (baud)
  {
    case B0:
      return 0;
    case B9600:
      return 9600;
    case B19200:
      return 19200;
    case B38400:
      return 38400;
#ifdef B57600
    case B57600:
      return 57600;
#endif  // B57600
#ifdef B128000
    case B128000:
      return 128000;
#endif  // B128000
#ifdef B115200
    case B115200:
      return 115200;
#endif  // B115200
#ifdef B230400
    case B230400:
      return 230400;
#endif  // B230400
#ifdef B460800
    case B460800:
      return 460800;
#endif  // B460800
#ifdef B576000
    case B576000:
      return 576000;
#endif  // B576000
#ifdef B921600
    case B921600:
      return 921600;
#endif  // B921600
  }
  return -1;
}